

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

void startElementTokenizer(void *ctx,xmlChar *name,xmlChar **atts)

{
  xmlChar **ppxVar1;
  
  pendingTokenizer(*(xmlTokenizerConfig **)((long)ctx + 0x1a8));
  fprintf((FILE *)SAXdebug,"StartTag\n%s",name);
  if (atts != (xmlChar **)0x0) {
    for (ppxVar1 = atts + 1; ppxVar1[-1] != (xmlChar *)0x0; ppxVar1 = ppxVar1 + 2) {
      fprintf((FILE *)SAXdebug," %s=");
      if (*ppxVar1 != (xmlChar *)0x0) {
        fputs((char *)*ppxVar1,(FILE *)SAXdebug);
      }
    }
  }
  fputc(10,(FILE *)SAXdebug);
  return;
}

Assistant:

static void
startElementTokenizer(void *ctx, const xmlChar *name, const xmlChar **atts) {
    xmlParserCtxtPtr ctxt = ctx;
    xmlTokenizerConfig *config = ctxt->_private;
    int i;

    pendingTokenizer(config);

    fprintf(SAXdebug, "StartTag\n%s", name);
    if (atts != NULL) {
        for (i = 0; atts[i] != NULL; i += 2) {
	    fprintf(SAXdebug, " %s=", atts[i]);
            if (atts[i+1] != NULL)
	        fprintf(SAXdebug, "%s", atts[i+1]);
        }
    }
    fprintf(SAXdebug, "\n");
}